

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  Block *pBVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  Record local_9f8;
  Record local_9d0;
  Record local_9a8;
  Record local_980;
  Record local_958;
  Record local_930;
  Record local_908;
  Record local_8e0;
  Record local_8b8;
  Record local_890;
  Record local_868;
  Record local_840;
  Record local_818;
  Record local_7f0;
  Record local_7c8;
  Record local_7a0;
  Record local_778;
  Record local_750;
  undefined1 local_728 [8];
  Record r1;
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  allocator local_4c0 [8];
  Record r19;
  undefined1 local_478 [8];
  Record r2;
  Record r3;
  Record r4;
  Record r5;
  Record r6;
  Record r7;
  Record r8;
  Record r9;
  Record r10;
  Record r11;
  Record r12;
  Record r13;
  Record r14;
  Record r15;
  Record r16;
  Record r17;
  Record r18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined4 local_bc;
  int local_b8 [2];
  shared_ptr<Block> b10;
  shared_ptr<Block> b9;
  shared_ptr<Block> b1;
  shared_ptr<Block> b2;
  shared_ptr<Block> b3;
  shared_ptr<Block> b4;
  shared_ptr<Block> b5;
  shared_ptr<Block> b6;
  shared_ptr<Block> b7;
  shared_ptr<Block> b8;
  
  BPlusTree::BPlusTree((BPlusTree *)ctx,3);
  std::__cxx11::string::string((string *)&r1.averageRating,"r1",(allocator *)local_478);
  std::__cxx11::string::string((string *)local_728,(string *)&r1.averageRating);
  r1.tconst.field_2._8_8_ = 0x13f800000;
  std::__cxx11::string::~string((string *)&r1.averageRating);
  std::__cxx11::string::string(local_6e0,"r2",(allocator *)&r2.averageRating);
  std::__cxx11::string::string((string *)local_478,local_6e0);
  r2.tconst.field_2._8_8_ = 0x240000000;
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::string(local_6c0,"r3",(allocator *)&r3.averageRating);
  std::__cxx11::string::string((string *)&r2.averageRating,local_6c0);
  r3.tconst.field_2._8_8_ = 0x340400000;
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::string(local_6a0,"r4",(allocator *)&r4.averageRating);
  std::__cxx11::string::string((string *)&r3.averageRating,local_6a0);
  r4.tconst.field_2._8_8_ = 0x440800000;
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::string(local_680,"r5",(allocator *)&r5.averageRating);
  std::__cxx11::string::string((string *)&r4.averageRating,local_680);
  r5.tconst.field_2._8_8_ = 0x540a00000;
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::string(local_660,"r6",(allocator *)&r6.averageRating);
  std::__cxx11::string::string((string *)&r5.averageRating,local_660);
  r6.tconst.field_2._8_8_ = 0x640c00000;
  std::__cxx11::string::~string(local_660);
  std::__cxx11::string::string(local_640,"r7",(allocator *)&r7.averageRating);
  std::__cxx11::string::string((string *)&r6.averageRating,local_640);
  r7.tconst.field_2._8_8_ = 0x740e00000;
  std::__cxx11::string::~string(local_640);
  std::__cxx11::string::string(local_620,"r8",(allocator *)&r8.averageRating);
  std::__cxx11::string::string((string *)&r7.averageRating,local_620);
  r8.tconst.field_2._8_8_ = 0x841000000;
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::string(local_600,"r9",(allocator *)&r9.averageRating);
  std::__cxx11::string::string((string *)&r8.averageRating,local_600);
  r9.tconst.field_2._8_8_ = 0x941100000;
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::string(local_5e0,"r10",(allocator *)&r10.averageRating);
  std::__cxx11::string::string((string *)&r9.averageRating,local_5e0);
  r10.tconst.field_2._8_8_ = 0xa41200000;
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::string(local_5c0,"r11",(allocator *)&r11.averageRating);
  std::__cxx11::string::string((string *)&r10.averageRating,local_5c0);
  r11.tconst.field_2._8_8_ = 0xb41300000;
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::string(local_5a0,"r12",(allocator *)&r12.averageRating);
  std::__cxx11::string::string((string *)&r11.averageRating,local_5a0);
  r12.tconst.field_2._8_8_ = 0xc41400000;
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::string::string(local_580,"r13",(allocator *)&r13.averageRating);
  std::__cxx11::string::string((string *)&r12.averageRating,local_580);
  r13.tconst.field_2._8_8_ = 0xd41500000;
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::string(local_560,"r14",(allocator *)&r14.averageRating);
  std::__cxx11::string::string((string *)&r13.averageRating,local_560);
  r14.tconst.field_2._8_8_ = 0xe41600000;
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::string(local_540,"r15",(allocator *)&r15.averageRating);
  std::__cxx11::string::string((string *)&r14.averageRating,local_540);
  r15.tconst.field_2._8_8_ = 0xf41700000;
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::string(local_520,"r16",(allocator *)&r16.averageRating);
  std::__cxx11::string::string((string *)&r15.averageRating,local_520);
  r16.tconst.field_2._8_8_ = 0x1041800000;
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::string(local_500,"r17",(allocator *)&r17.averageRating);
  std::__cxx11::string::string((string *)&r16.averageRating,local_500);
  r17.tconst.field_2._8_8_ = 0x1141880000;
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::string(local_4e0,"r18",local_4c0);
  std::__cxx11::string::string((string *)&r17.averageRating,local_4e0);
  r18.tconst.field_2._8_8_ = 0x1241900000;
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::string
            ((string *)&r19.averageRating,"r19",
             (allocator *)&b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string((string *)local_4c0,(string *)&r19.averageRating);
  r19.tconst.field_2._8_8_ = 0x1341980000;
  std::__cxx11::string::~string((string *)&r19.averageRating);
  b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 2;
  std::make_shared<Block,int>
            ((int *)&b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_b8[0] = 2;
  std::make_shared<Block,int>
            ((int *)&b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_bc = 2;
  std::make_shared<Block,int>(local_b8);
  this = b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Record::Record(&local_9f8,(Record *)local_728);
  Block::addRecord((Block *)this._M_pi,&local_9f8);
  std::__cxx11::string::~string((string *)&local_9f8);
  Record::Record(&local_9d0,(Record *)local_478);
  Block::addRecord((Block *)b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi,&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  pBVar1 = (Block *)CONCAT44(b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_9a8,(Record *)&r2.averageRating);
  Block::addRecord(pBVar1,&local_9a8);
  std::__cxx11::string::~string((string *)&local_9a8);
  pBVar1 = (Block *)CONCAT44(b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_980,(Record *)&r3.averageRating);
  Block::addRecord(pBVar1,&local_980);
  std::__cxx11::string::~string((string *)&local_980);
  pBVar1 = (Block *)CONCAT44(b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_958,(Record *)&r4.averageRating);
  Block::addRecord(pBVar1,&local_958);
  std::__cxx11::string::~string((string *)&local_958);
  pBVar1 = (Block *)CONCAT44(b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_930,(Record *)&r5.averageRating);
  Block::addRecord(pBVar1,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  pBVar1 = (Block *)CONCAT44(b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_908,(Record *)&r6.averageRating);
  Block::addRecord(pBVar1,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  pBVar1 = (Block *)CONCAT44(b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_8e0,(Record *)&r7.averageRating);
  Block::addRecord(pBVar1,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  pBVar1 = (Block *)CONCAT44(b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_8b8,(Record *)&r8.averageRating);
  Block::addRecord(pBVar1,&local_8b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  pBVar1 = (Block *)CONCAT44(b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_890,(Record *)&r9.averageRating);
  Block::addRecord(pBVar1,&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  pBVar1 = (Block *)CONCAT44(b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_868,(Record *)&r10.averageRating);
  Block::addRecord(pBVar1,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  pBVar1 = (Block *)CONCAT44(b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_840,(Record *)&r11.averageRating);
  Block::addRecord(pBVar1,&local_840);
  std::__cxx11::string::~string((string *)&local_840);
  pBVar1 = (Block *)CONCAT44(b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_818,(Record *)&r12.averageRating);
  Block::addRecord(pBVar1,&local_818);
  std::__cxx11::string::~string((string *)&local_818);
  pBVar1 = (Block *)CONCAT44(b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_7f0,(Record *)&r13.averageRating);
  Block::addRecord(pBVar1,&local_7f0);
  std::__cxx11::string::~string((string *)&local_7f0);
  pBVar1 = (Block *)CONCAT44(b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_7c8,(Record *)&r14.averageRating);
  Block::addRecord(pBVar1,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  pBVar1 = (Block *)CONCAT44(b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_7a0,(Record *)&r15.averageRating);
  Block::addRecord(pBVar1,&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  pBVar1 = (Block *)CONCAT44(b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_778,(Record *)&r16.averageRating);
  Block::addRecord(pBVar1,&local_778);
  std::__cxx11::string::~string((string *)&local_778);
  pBVar1 = (Block *)CONCAT44(b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._4_4_,
                             b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_4_);
  Record::Record(&local_750,(Record *)&r17.averageRating);
  Block::addRecord(pBVar1,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)&r18.averageRating,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,1.0,(shared_ptr<Block> *)&r18.averageRating);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c0,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b9.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,2.0,(shared_ptr<Block> *)&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b0,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,3.0,(shared_ptr<Block> *)&local_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a0,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b1.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,4.0,(shared_ptr<Block> *)&local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_190,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,5.0,(shared_ptr<Block> *)&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_180,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b2.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,6.0,(shared_ptr<Block> *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_170,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,7.0,(shared_ptr<Block> *)&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_160,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b3.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,8.0,(shared_ptr<Block> *)&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_150,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,9.0,(shared_ptr<Block> *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_140,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b4.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,10.0,(shared_ptr<Block> *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_130,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,11.0,(shared_ptr<Block> *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b5.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,12.0,(shared_ptr<Block> *)&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,13.0,(shared_ptr<Block> *)&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_100,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b6.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,14.0,(shared_ptr<Block> *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,15.0,(shared_ptr<Block> *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b7.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,16.0,(shared_ptr<Block> *)&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  std::__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d0,
             (__shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2> *)
             &b10.super___shared_ptr<Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BPlusTree::InsertKey((BPlusTree *)ctx,17.0,(shared_ptr<Block> *)&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b7);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b1);
  std::__cxx11::string::~string((string *)local_4c0);
  std::__cxx11::string::~string((string *)&r17.averageRating);
  std::__cxx11::string::~string((string *)&r16.averageRating);
  std::__cxx11::string::~string((string *)&r15.averageRating);
  std::__cxx11::string::~string((string *)&r14.averageRating);
  std::__cxx11::string::~string((string *)&r13.averageRating);
  std::__cxx11::string::~string((string *)&r12.averageRating);
  std::__cxx11::string::~string((string *)&r11.averageRating);
  std::__cxx11::string::~string((string *)&r10.averageRating);
  std::__cxx11::string::~string((string *)&r9.averageRating);
  std::__cxx11::string::~string((string *)&r8.averageRating);
  std::__cxx11::string::~string((string *)&r7.averageRating);
  std::__cxx11::string::~string((string *)&r6.averageRating);
  std::__cxx11::string::~string((string *)&r5.averageRating);
  std::__cxx11::string::~string((string *)&r4.averageRating);
  std::__cxx11::string::~string((string *)&r3.averageRating);
  std::__cxx11::string::~string((string *)&r2.averageRating);
  std::__cxx11::string::~string((string *)local_478);
  std::__cxx11::string::~string((string *)local_728);
  return (int)ctx;
}

Assistant:

BPlusTree init() {
	BPlusTree bplustree(3);
	
	Record r1("r1", 1.00, 1);
	Record r2("r2", 2.00, 2);
	Record r3("r3", 3.00, 3);
	Record r4("r4", 4.00, 4);
	Record r5("r5", 5.00, 5);
	Record r6("r6", 6.00, 6);
	Record r7("r7", 7.00, 7);
	Record r8("r8", 8.00, 8);
	Record r9("r9", 9.00, 9);
	Record r10("r10", 10.00, 10);

	Record r11("r11", 11.00, 11);
	Record r12("r12", 12.00, 12);
	Record r13("r13", 13.00, 13);
	Record r14("r14", 14.00, 14);
	Record r15("r15", 15.00, 15);
	Record r16("r16", 16.00, 16);
	Record r17("r17", 17.00, 17);
	Record r18("r18", 18.00, 18);
	Record r19("r19", 19.00, 19);

	// each block only 2 record
	std::shared_ptr<Block> b1 = std::make_shared<Block>(2);
	// std::cerr << "block address: " << b1 << std::endl;
	std::shared_ptr<Block> b2 = std::make_shared<Block>(2);
	// std::cerr << "block address b2: " << b2 << std::endl;
	std::shared_ptr<Block> b3 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b4 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b5 = std::make_shared<Block>(2);

	std::shared_ptr<Block> b6 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b7 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b8 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b9 = std::make_shared<Block>(2);
	std::shared_ptr<Block> b10 = std::make_shared<Block>(2);

	b1->addRecord(r1);
	b1->addRecord(r2);
    
    b2->addRecord(r3);
	b2->addRecord(r4);

    b3->addRecord(r5);
    b3->addRecord(r6);

	b4->addRecord(r7);
	b4->addRecord(r8);

	b5->addRecord(r9);
	b5->addRecord(r10);

	b6->addRecord(r11);
	b6->addRecord(r12);

	b7->addRecord(r13);
	b7->addRecord(r14);

	b8->addRecord(r15);
	b8->addRecord(r16);

	b9->addRecord(r17);
	b9->addRecord(r18);

	bplustree.InsertKey(1.00, b1);
	bplustree.InsertKey(2.00, b1);

	bplustree.InsertKey(3.00, b2);
    bplustree.InsertKey(4.00, b2);

    bplustree.InsertKey(5.00, b3);
    bplustree.InsertKey(6.00, b3);
 
	bplustree.InsertKey(7.00, b4);
    bplustree.InsertKey(8.00, b4);

	bplustree.InsertKey(9.00, b5);
    bplustree.InsertKey(10.00, b5);

	bplustree.InsertKey(11.00, b6);
	bplustree.InsertKey(12.00, b6);

	bplustree.InsertKey(13.00, b7);
	bplustree.InsertKey(14.00, b7);

	bplustree.InsertKey(15.00, b8);
	bplustree.InsertKey(16.00, b8);

	bplustree.InsertKey(17.00, b9);

	return bplustree;
}